

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription_status_codec.cpp
# Opt level: O2

SubscriptionStatus bidfx_public_api::provider::SubscriptionStatusCodec::DecodeStatus(uchar encoding)

{
  SubscriptionStatus SVar1;
  
  SVar1 = PENDING;
  if ((byte)(encoding + 0xbd) < 0x13) {
    SVar1 = (&DAT_001df864)[(byte)(encoding + 0xbd)];
  }
  return SVar1;
}

Assistant:

SubscriptionStatus SubscriptionStatusCodec::DecodeStatus(unsigned char encoding)
{
    switch (encoding)
    {
        case 'C':
            return SubscriptionStatus::CANCELLED;
        case 'D':
            return SubscriptionStatus::DISCONTINUED;
        case 'E':
            return SubscriptionStatus::EXHAUSTED;
        case 'H':
            return SubscriptionStatus::PROHIBITED;
        case 'I':
            return SubscriptionStatus::INACTIVE;
        case 'L':
            return SubscriptionStatus::CLOSED;
        case 'O':
            return SubscriptionStatus::OK;
        case 'P':
            return SubscriptionStatus::PENDING;
        case 'R':
            return SubscriptionStatus::REJECTED;
        case 'S':
            return SubscriptionStatus::STALE;
        case 'T':
            return SubscriptionStatus::TIMEOUT;
        case 'U':
            return SubscriptionStatus::UNAVAILABLE;
        default:
            return SubscriptionStatus::PENDING;
    }
}